

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.cpp
# Opt level: O0

string * __thiscall iDynTree::Triplets::description_abi_cxx11_(Triplets *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pTVar3;
  string *in_RDI;
  const_iterator triplet;
  ostringstream str;
  Triplets *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe10;
  __normal_iterator<const_iDynTree::Triplet_*,_std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>_>
  local_190;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_190._M_current = (Triplet *)begin(in_stack_fffffffffffffe08);
  while( true ) {
    end(in_stack_fffffffffffffe08);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_iDynTree::Triplet_*,_std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>_>
                        *)in_stack_fffffffffffffe10,
                       (__normal_iterator<const_iDynTree::Triplet_*,_std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>_>
                        *)in_stack_fffffffffffffe08);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)local_188,"(");
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_iDynTree::Triplet_*,_std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>_>
             ::operator->(&local_190);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pTVar3->row);
    poVar2 = std::operator<<(poVar2,",");
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_iDynTree::Triplet_*,_std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>_>
             ::operator->(&local_190);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pTVar3->column);
    poVar2 = std::operator<<(poVar2,")");
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_iDynTree::Triplet_*,_std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>_>
             ::operator->(&local_190);
    in_stack_fffffffffffffe10 = (ostream *)std::ostream::operator<<(poVar2,pTVar3->value);
    std::ostream::operator<<(in_stack_fffffffffffffe10,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_iDynTree::Triplet_*,_std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>_>
    ::operator++(&local_190);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string Triplets::description() const
    {
        std::ostringstream str;
        for (const_iterator triplet(begin()); triplet != end(); ++triplet) {
            str << "(" << triplet->row << "," << triplet->column << ")" << triplet->value << std::endl;
        }
        return str.str();
    }